

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileAnnonFunc(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxi32 sVar1;
  SyHashEntry *pSVar2;
  sxu32 local_248;
  sxi32 rc;
  sxu32 nLen;
  sxu32 nIdx;
  SyString sName;
  jx9_value *pObj;
  char zName [512];
  jx9_vm_func *pAnnonFunc;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn->nType & 0xc) != 0) {
    pGen->pIn = pGen->pIn + 1;
  }
  sName._8_8_ = jx9VmReserveConstObj(pGen->pVm,(sxu32 *)&rc);
  if ((jx9_value *)sName._8_8_ == (jx9_value *)0x0) {
    GenStateOutOfMem(pGen);
    pGen_local._4_4_ = -10;
  }
  else {
    jx9CompileAnnonFunc::iCnt = jx9CompileAnnonFunc::iCnt + 1;
    local_248 = SyBufferFormat((char *)&pObj,0x200,"[lambda_%d]");
    while (pSVar2 = SyHashGet(&pGen->pVm->hFunction,&pObj,local_248),
          pSVar2 != (SyHashEntry *)0x0 && local_248 < 0x1fe) {
      jx9CompileAnnonFunc::iCnt = jx9CompileAnnonFunc::iCnt + 1;
      local_248 = SyBufferFormat((char *)&pObj,0x200,"[lambda_%d]");
    }
    _nLen = &pObj;
    sName.zString._0_4_ = local_248;
    jx9MemObjInitFromString(pGen->pVm,(jx9_value *)sName._8_8_,(SyString *)&nLen);
    sVar1 = GenStateCompileFunc(pGen,(SyString *)&nLen,0,(jx9_vm_func **)(zName + 0x1f8));
    if (sVar1 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      jx9VmEmitInstr(pGen->pVm,4,0,rc,(void *)0x0,(sxu32 *)0x0);
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileAnnonFunc(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	jx9_vm_func *pAnnonFunc; /* Annonymous function body */
	char zName[512];         /* Unique lambda name */
	static int iCnt = 1;     /* There is no worry about thread-safety here, because only
							  * one thread is allowed to compile the script.
						      */
	jx9_value *pObj;
	SyString sName;
	sxu32 nIdx;
	sxu32 nLen;
	sxi32 rc;

	pGen->pIn++; /* Jump the 'function' keyword */
	if( pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD) ){
		pGen->pIn++;
	}
	/* Reserve a constant for the lambda */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		GenStateOutOfMem(pGen);
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	/* Generate a unique name */
	nLen = SyBufferFormat(zName, sizeof(zName), "[lambda_%d]", iCnt++);
	/* Make sure the generated name is unique */
	while( SyHashGet(&pGen->pVm->hFunction, zName, nLen) != 0 && nLen < sizeof(zName) - 2 ){
		nLen = SyBufferFormat(zName, sizeof(zName), "[lambda_%d]", iCnt++);
	}
	SyStringInitFromBuf(&sName, zName, nLen);
	jx9MemObjInitFromString(pGen->pVm, pObj, &sName);
	/* Compile the lambda body */
	rc = GenStateCompileFunc(&(*pGen),&sName,0,&pAnnonFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}